

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O2

BlockCode __thiscall
s2coding::GetBlockCode
          (s2coding *this,Span<const_unsigned_long_long> values,uint64 base,bool have_exceptions)

{
  bool bVar1;
  ulong uVar2;
  bool have_exceptions_00;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint64 d_min;
  uint delta_bits;
  ulong uVar10;
  BlockCode BVar11;
  S2LogMessage local_40;
  
  uVar2 = 0xffffffffffffffff;
  uVar5 = 0;
  for (lVar7 = 0; (long)values.ptr_ * 8 - lVar7 != 0; lVar7 = lVar7 + 8) {
    uVar10 = *(ulong *)(this + lVar7);
    uVar8 = uVar2;
    if (uVar10 < uVar2) {
      uVar8 = uVar10;
    }
    uVar9 = uVar10;
    if (uVar10 < uVar5) {
      uVar9 = uVar5;
    }
    if (uVar10 != 0xffffffffffffffff) {
      uVar2 = uVar8;
      uVar5 = uVar9;
    }
  }
  if (uVar2 == 0xffffffffffffffff) {
    uVar2 = 4;
    iVar3 = 0;
  }
  else {
    d_min = uVar2 - values.len_;
    uVar10 = uVar5 - values.len_;
    lVar7 = 0x3f;
    if (uVar10 - d_min != 0) {
      for (; uVar10 - d_min >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    delta_bits = (int)lVar7 + 3 + (uint)((int)lVar7 == 0) & 0x7c;
    iVar3 = 4;
    if (uVar5 == uVar2) {
      delta_bits = 4;
    }
    have_exceptions_00 = SUB81(base,0);
    bVar6 = 0;
    bVar1 = CanEncode(d_min,uVar10,delta_bits,0,have_exceptions_00);
    if (bVar1) {
      iVar3 = 0;
    }
    else {
      bVar1 = CanEncode(d_min,uVar10,delta_bits,4,have_exceptions_00);
      bVar6 = 1;
      if (!bVar1) {
        if (0x3c < delta_bits) {
          S2LogMessage::S2LogMessage
                    (&local_40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                     ,0x2da,kFatal,(ostream *)&std::cerr);
          std::operator<<(local_40.stream_,"Check failed: (delta_bits) <= (60) ");
          goto LAB_001d5f2d;
        }
        delta_bits = delta_bits + 4;
        iVar3 = 0;
        bVar1 = CanEncode(d_min,uVar10,delta_bits,0,have_exceptions_00);
        if (bVar1) {
          bVar6 = 0;
        }
        else {
          iVar3 = 4;
          bVar1 = CanEncode(d_min,uVar10,delta_bits,4,have_exceptions_00);
          if (!bVar1) {
            S2LogMessage::S2LogMessage
                      (&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                       ,0x2dd,kFatal,(ostream *)&std::cerr);
            std::operator<<(local_40.stream_,
                            "Check failed: CanEncode(b_min, b_max, delta_bits, 4, have_exceptions) "
                           );
            goto LAB_001d5f2d;
          }
        }
      }
    }
    if (values.ptr_ == (pointer)0x1) {
      if (!(bool)(~bVar6 & delta_bits == 4)) {
        S2LogMessage::S2LogMessage
                  (&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                   ,0x2e6,kFatal,(ostream *)&std::cerr);
        std::operator<<(local_40.stream_,"Check failed: delta_bits == 4 && overlap_bits == 0 ");
        goto LAB_001d5f2d;
      }
      delta_bits = 8;
      uVar2 = 0xff;
    }
    else {
      uVar2 = 0;
      if (delta_bits != 0) {
        uVar2 = 0xffffffffffffffff >> (-(char)delta_bits & 0x3fU);
      }
    }
    uVar2 = (uVar2 + (ulong)(have_exceptions_00 ^ 1) * 0x10) - 0x10;
    lVar7 = uVar10 - uVar2;
    if (uVar10 < uVar2 || lVar7 == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      if (delta_bits - iVar3 != 0) {
        uVar2 = 0xffffffffffffffff >> (-((char)delta_bits - (char)iVar3) & 0x3fU);
      }
      uVar2 = ~uVar2 & lVar7 + uVar2;
      if (uVar2 == 0) {
        S2LogMessage::S2LogMessage
                  (&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                   ,0x2f4,kFatal,(ostream *)&std::cerr);
        std::operator<<(local_40.stream_,"Check failed: (min_offset) > (0) ");
LAB_001d5f2d:
        abort();
      }
      lVar7 = 0x3f;
      if (uVar2 != 0) {
        for (; uVar2 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      uVar4 = 0x47 - ((delta_bits - iVar3) + ((uint)lVar7 ^ 0x3f)) & 0xfffffff8;
      if (uVar4 == 0x40) {
        iVar3 = 4;
      }
      uVar2 = (ulong)uVar4 << 0x20;
    }
    uVar2 = delta_bits | uVar2;
  }
  BVar11.overlap_bits = iVar3;
  BVar11.delta_bits = (int)uVar2;
  BVar11.offset_bits = (int)(uVar2 >> 0x20);
  return BVar11;
}

Assistant:

BlockCode GetBlockCode(Span<const uint64> values, uint64 base,
                       bool have_exceptions) {
  // "b_min" and "b_max"n are the minimum and maximum values within this block.
  uint64 b_min = kException, b_max = 0;
  for (uint64 v : values) {
    if (v != kException) {
      b_min = min(b_min, v);
      b_max = max(b_max, v);
    }
  }
  if (b_min == kException) {
    // All values in this block are exceptions.
    return BlockCode{4, 0, 0};
  }

  // Adjust the min/max values so that they are relative to "base".
  b_min -= base;
  b_max -= base;

  // Determine the minimum possible delta length and overlap that can be used
  // to encode this block.  The block will usually be encodable using the
  // number of bits in (b_max - b_min) rounded up to a multiple of 4.  If this
  // is not possible, the preferred solution is to shift "offset" so that the
  // delta and offset values overlap by 4 bits (since this only costs an
  // average of 4 extra bits per block).  Otherwise we increase the delta size
  // by 4 bits.  Certain cases require that both of these techniques are used.
  //
  // Example 1: b_min = 0x72, b_max = 0x7e.  The range is 0x0c.  This can be
  // encoded using delta_bits = 4 and overlap_bits = 0, which allows us to
  // represent an offset of 0x70 and a maximum delta of 0x0f, so that we can
  // encode values up to 0x7f.
  //
  // Example 2: b_min = 0x78, b_max = 0x84.  The range is 0x0c, but in this
  // case it is not sufficient to use delta_bits = 4 and overlap_bits = 0
  // because we can again only represent an offset of 0x70, so the maximum
  // delta of 0x0f only lets us encode values up to 0x7f.  However if we
  // increase the overlap to 4 bits then we can represent an offset of 0x78,
  // which lets us encode values up to 0x78 + 0x0f = 0x87.
  //
  // Example 3: b_min = 0x08, b_max = 0x104.  The range is 0xfc, so we should
  // be able to use 8-bit deltas.  But even with a 4-bit overlap, we can still
  // only encode offset = 0 and a maximum value of 0xff.  (We don't allow
  // bigger overlaps because statistically they are not worthwhile.)  Instead
  // we increase the delta size to 12 bits, which handles this case easily.
  //
  // Example 4: b_min = 0xf08, b_max = 0x1004.  The range is 0xfc, so we
  // should be able to use 8-bit deltas.  With 8-bit deltas and no overlap, we
  // have offset = 0xf00 and a maximum encodable value of 0xfff.  With 8-bit
  // deltas and a 4-bit overlap, we still have offset = 0xf00 and a maximum
  // encodable value of 0xfff.  Even with 12-bit deltas, we have offset = 0
  // and we can still only represent 0xfff.  However with delta_bits = 12 and
  // overlap_bits = 4, we can represent offset = 0xf00 and a maximum encodable
  // value of 0xf00 + 0xfff = 0x1eff.
  //
  // It is possible to show that this last example is the worst case, i.e.  we
  // do not need to consider increasing delta_bits or overlap_bits further.
  int delta_bits = (max(1, Bits::Log2Floor64(b_max - b_min)) + 3) & ~3;
  int overlap_bits = 0;
  if (!CanEncode(b_min, b_max, delta_bits, 0, have_exceptions)) {
    if (CanEncode(b_min, b_max, delta_bits, 4, have_exceptions)) {
      overlap_bits = 4;
    } else {
      S2_DCHECK_LE(delta_bits, 60);
      delta_bits += 4;
      if (!CanEncode(b_min, b_max, delta_bits, 0, have_exceptions)) {
        S2_DCHECK(CanEncode(b_min, b_max, delta_bits, 4, have_exceptions));
        overlap_bits = 4;
      }
    }
  }

  // Avoid wasting 4 bits of delta when the block size is 1.  This reduces the
  // encoding size for single leaf cells by one byte.
  if (values.size() == 1) {
    S2_DCHECK(delta_bits == 4 && overlap_bits == 0);
    delta_bits = 8;
  }

  // Now determine the number of bytes needed to encode "offset", given the
  // chosen delta length.
  uint64 max_delta = BitMask(delta_bits) - (have_exceptions ? kBlockSize : 0);
  int offset_bits = 0;
  if (b_max > max_delta) {
    // At least one byte of offset is required.  Round up the minimum offset
    // to the next encodable value, and determine how many bits it has.
    int offset_shift = delta_bits - overlap_bits;
    uint64 mask = BitMask(offset_shift);
    uint64 min_offset = (b_max - max_delta + mask) & ~mask;
    S2_DCHECK_GT(min_offset, 0);
    offset_bits =
        (Bits::FindMSBSetNonZero64(min_offset) + 1 - offset_shift + 7) & ~7;
    // A 64-bit offset can only be encoded with an overlap of 4 bits.
    if (offset_bits == 64) overlap_bits = 4;
  }
  return BlockCode{delta_bits, offset_bits, overlap_bits};
}